

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkproxy.cpp
# Opt level: O3

void __thiscall
QNetworkProxy::setRawHeader(QNetworkProxy *this,QByteArray *headerName,QByteArray *headerValue)

{
  QSharedDataPointer<QNetworkProxyPrivate>::detach(&this->d);
  if (((this->d).d.ptr)->type != HttpProxy) {
    QSharedDataPointer<QNetworkProxyPrivate>::detach(&this->d);
    if (((this->d).d.ptr)->type != HttpCachingProxy) {
      return;
    }
  }
  QSharedDataPointer<QNetworkProxyPrivate>::detach(&this->d);
  QNetworkHeadersPrivate::setRawHeader(&((this->d).d.ptr)->headers,headerName,headerValue);
  return;
}

Assistant:

void QNetworkProxy::setRawHeader(const QByteArray &headerName, const QByteArray &headerValue)
{
    if (d->type == HttpProxy || d->type == HttpCachingProxy)
        d->headers.setRawHeader(headerName, headerValue);
}